

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O0

void __thiscall
InsertProxyModelPrivate::onMoved
          (InsertProxyModelPrivate *this,bool isRow,QModelIndex *parent,int start,int end,
          QModelIndex *destination,int destIdx)

{
  bool bVar1;
  InsertProxyModel *q;
  QModelIndex *destination_local;
  int end_local;
  int start_local;
  QModelIndex *parent_local;
  bool isRow_local;
  InsertProxyModelPrivate *this_local;
  
  bVar1 = QModelIndex::isValid(parent);
  if (!bVar1) {
    bVar1 = QModelIndex::isValid(destination);
    destination_local._0_4_ = end;
    if (bVar1) {
      onRemoved(this,isRow,parent,start,end);
    }
    else {
      for (; start <= (int)destination_local; destination_local._0_4_ = (int)destination_local + -1)
      {
        QList<QMap<int,_QVariant>_>::move
                  (this->m_extraData + ((isRow ^ 0xffU) & 1),(long)(int)destination_local,
                   (long)destIdx);
      }
      q_func(this);
      if (isRow) {
        QAbstractItemModel::endMoveRows();
      }
      else {
        QAbstractItemModel::endMoveColumns();
      }
    }
  }
  return;
}

Assistant:

void InsertProxyModelPrivate::onMoved(bool isRow, const QModelIndex &parent, int start, int end, const QModelIndex &destination, int destIdx)
{
    if (parent.isValid())
        return;
    if (destination.isValid())
        return onRemoved(isRow, parent, start, end);
    for (; start <= end; --end)
        m_extraData[!isRow].move(end, destIdx);
    Q_Q(InsertProxyModel);
    isRow ? q->endMoveRows() : q->endMoveColumns();
}